

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void reset_room(ROOM_INDEX_DATA *pRoom)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  OBJ_INDEX_DATA *pOVar4;
  int *piVar5;
  long lVar6;
  CLogger *this;
  room_index_data *in_RDI;
  __type _Var7;
  int d1;
  int d0;
  EXIT_DATA *pExit;
  int limit_1;
  int j;
  int i;
  int olevel;
  ROOM_INDEX_DATA *pRoomIndexPrev;
  int limit;
  int count;
  OBJ_DATA *secondary;
  OBJ_INDEX_DATA *pObjToIndex;
  OBJ_INDEX_DATA *pObjIndex;
  MOB_INDEX_DATA *pMobIndex;
  ROOM_INDEX_DATA *pRoomIndex;
  bool found;
  CHAR_DATA *rch;
  char buf [4608];
  int level;
  bool last;
  EXIT_DATA *pexit;
  OBJ_DATA *LastObj;
  CHAR_DATA *LastMob;
  OBJ_DATA *pObj2;
  OBJ_DATA *pObj;
  CHAR_DATA *mob;
  CHAR_DATA *pMob;
  RESET_DATA *pReset;
  short *in_stack_ffffffffffffec08;
  int in_stack_ffffffffffffec10;
  int in_stack_ffffffffffffec14;
  OBJ_INDEX_DATA *in_stack_ffffffffffffec18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffec20;
  int local_13c8;
  int local_13c4;
  short *in_stack_ffffffffffffec40;
  short *in_stack_ffffffffffffec50;
  CLogger *in_stack_ffffffffffffec58;
  int in_stack_ffffffffffffec60;
  int in_stack_ffffffffffffec64;
  EXIT_DATA *in_stack_ffffffffffffec68;
  int local_136c;
  int local_1368;
  int local_1364;
  int in_stack_ffffffffffffeca0;
  int in_stack_ffffffffffffeca4;
  int local_1358;
  int local_1354;
  int local_1350;
  int local_134c [2];
  int in_stack_ffffffffffffecbc;
  OBJ_INDEX_DATA *in_stack_ffffffffffffecc0;
  MOB_INDEX_DATA *in_stack_ffffffffffffece0;
  int local_1308;
  int local_1304 [17];
  ROOM_INDEX_DATA *local_12c0;
  int local_1298;
  int local_1294;
  obj_data *local_1290;
  OBJ_INDEX_DATA *local_1288;
  OBJ_INDEX_DATA *local_1280;
  MOB_INDEX_DATA *local_1278;
  ROOM_INDEX_DATA *local_1270;
  byte local_1261;
  char_data *local_1260;
  int local_50;
  byte local_49;
  EXIT_DATA *local_48;
  obj_data *local_40;
  char_data *local_38;
  obj_data *local_30;
  OBJ_DATA *local_28;
  CHAR_DATA *local_20;
  char_data *local_18;
  RESET_DATA *local_10;
  room_index_data *local_8;
  
  local_38 = (char_data *)0x0;
  local_40 = (obj_data *)0x0;
  local_48 = (EXIT_DATA *)0x0;
  local_50 = 0;
  if (in_RDI != (room_index_data *)0x0) {
    local_18 = (char_data *)0x0;
    local_49 = 1;
    if (in_RDI->trap != (TRAP_DATA *)0x0) {
      in_RDI->trap->armed = true;
    }
    local_8 = in_RDI;
    for (local_10 = in_RDI->reset_first; local_10 != (RESET_DATA *)0x0; local_10 = local_10->next) {
      local_1270 = (ROOM_INDEX_DATA *)0x0;
      local_1278 = (MOB_INDEX_DATA *)0x0;
      local_1280 = (OBJ_INDEX_DATA *)0x0;
      local_1288 = (OBJ_INDEX_DATA *)0x0;
      local_1290 = (obj_data *)0x0;
      this = (CLogger *)(ulong)((int)local_10->command - 0x44);
      iVar1 = (int)((ulong)in_stack_ffffffffffffec18 >> 0x20);
      switch(this) {
      case (CLogger *)0x0:
        local_1270 = get_room_index(iVar1);
        if (local_1270 == (ROOM_INDEX_DATA *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
          fmt_07._M_str = (char *)in_stack_ffffffffffffec58;
          fmt_07._M_len = (size_t)in_stack_ffffffffffffec50;
          CLogger::Warn<short&>(this,fmt_07,in_stack_ffffffffffffec40);
        }
        else {
          local_48 = local_1270->exit[local_10->arg2];
          if (local_48 != (EXIT_DATA *)0x0) {
            _Var7 = std::pow<int,int>(0,0x1d6141);
            local_48->exit_info[0] = local_48->exit_info[0] | (long)_Var7;
            in_stack_ffffffffffffec14 = (int)local_10->arg3;
            if (local_10->arg3 == 0) {
              _Var7 = std::pow<int,int>(0,0x1d619b);
              local_48->exit_info[0] = ((long)_Var7 ^ 0xffffffffffffffffU) & local_48->exit_info[0];
              _Var7 = std::pow<int,int>(0,0x1d61c0);
              local_48->exit_info[0] = ((long)_Var7 ^ 0xffffffffffffffffU) & local_48->exit_info[0];
            }
            else if (in_stack_ffffffffffffec14 == 1) {
              _Var7 = std::pow<int,int>(0,0x1d61ed);
              local_48->exit_info[0] = (long)_Var7 | local_48->exit_info[0];
              _Var7 = std::pow<int,int>(0,0x1d620e);
              local_48->exit_info[0] = ((long)_Var7 ^ 0xffffffffffffffffU) & local_48->exit_info[0];
            }
            else if (in_stack_ffffffffffffec14 == 2) {
              _Var7 = std::pow<int,int>(0,0x1d6238);
              local_48->exit_info[0] = (long)_Var7 | local_48->exit_info[0];
              _Var7 = std::pow<int,int>(0,0x1d6259);
              local_48->exit_info[0] = (long)_Var7 | local_48->exit_info[0];
            }
            local_49 = 1;
          }
        }
        break;
      case (CLogger *)0x1:
      case (CLogger *)0x3:
        pOVar4 = get_obj_index(iVar1);
        local_1280 = pOVar4;
        if (pOVar4 == (OBJ_INDEX_DATA *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
          fmt_05._M_str = (char *)in_stack_ffffffffffffec58;
          fmt_05._M_len = (size_t)in_stack_ffffffffffffec50;
          CLogger::Warn<short&>(this,fmt_05,in_stack_ffffffffffffec40);
        }
        else if ((local_49 & 1) != 0) {
          if (local_38 == (char_data *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
            fmt_06._M_str = (char *)in_stack_ffffffffffffec58;
            fmt_06._M_len = (size_t)in_stack_ffffffffffffec50;
            CLogger::Warn<short&>(this,fmt_06,in_stack_ffffffffffffec40);
            local_49 = 0;
          }
          else {
            if (local_38->pIndexData->pShop == (SHOP_DATA *)0x0) {
              if (local_10->arg2 < 0x33) {
                if ((local_10->arg2 == -1) || (local_10->arg2 == 0)) {
                  local_1364 = 999;
                }
                else {
                  local_1364 = (int)local_10->arg2;
                }
              }
              else {
                local_1364 = 6;
              }
              if ((pOVar4->limtotal <= pOVar4->limcount) && (0 < pOVar4->limtotal)) break;
              local_1368 = number_fuzzy(in_stack_ffffffffffffec14);
              local_136c = 0x32;
              std::min<int>(&local_1368,&local_136c);
              local_28 = create_object(in_stack_ffffffffffffecc0,in_stack_ffffffffffffecbc);
              pcVar3 = (char *)palloc_string("none");
              local_28->owner = pcVar3;
              in_stack_ffffffffffffec18 = pOVar4;
            }
            else {
              local_134c[0] = 0;
              if ((pOVar4->new_format & 1U) == 0) {
                in_stack_ffffffffffffec20 =
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     (ulong)((int)pOVar4->item_type - 2);
                iVar1 = (int)((ulong)in_stack_ffffffffffffec08 >> 0x20);
                switch(in_stack_ffffffffffffec20) {
                case (basic_string_view<char,_std::char_traits<char>_> *)0x0:
                case (basic_string_view<char,_std::char_traits<char>_> *)0x8:
                case (basic_string_view<char,_std::char_traits<char>_> *)0x18:
                  local_134c[0] = 0x35;
                  for (local_1350 = 1; local_1350 < 5; local_1350 = local_1350 + 1) {
                    if (0 < local_1280->value[local_1350]) {
                      for (local_1354 = 0; local_1354 < 0xc; local_1354 = local_1354 + 1) {
                        local_1358 = (int)*(short *)(Catch::formatReconstructedExpression +
                                                    (long)local_1354 * 2 +
                                                    (long)local_1280->value[local_1350] * 0x60);
                        piVar5 = std::min<int>(local_134c,&local_1358);
                        local_134c[0] = *piVar5;
                      }
                    }
                  }
                  in_stack_ffffffffffffeca4 = 0;
                  in_stack_ffffffffffffeca0 = (local_134c[0] * 3) / 4 + -2;
                  piVar5 = std::max<int>((int *)&stack0xffffffffffffeca4,
                                         (int *)&stack0xffffffffffffeca0);
                  local_134c[0] = *piVar5;
                  break;
                case (basic_string_view<char,_std::char_traits<char>_> *)0x1:
                  local_134c[0] = number_range(in_stack_ffffffffffffec10,iVar1);
                  break;
                case (basic_string_view<char,_std::char_traits<char>_> *)0x2:
                  local_134c[0] = number_range(in_stack_ffffffffffffec10,iVar1);
                  break;
                case (basic_string_view<char,_std::char_traits<char>_> *)0x3:
                  local_134c[0] = number_range(in_stack_ffffffffffffec10,iVar1);
                  break;
                default:
                  local_134c[0] = 0;
                  break;
                case (basic_string_view<char,_std::char_traits<char>_> *)0x6:
                  local_134c[0] = number_range(in_stack_ffffffffffffec10,iVar1);
                  break;
                case (basic_string_view<char,_std::char_traits<char>_> *)0x7:
                  local_134c[0] = number_range(in_stack_ffffffffffffec10,iVar1);
                }
              }
              local_28 = create_object(in_stack_ffffffffffffecc0,in_stack_ffffffffffffecbc);
              pcVar3 = (char *)palloc_string("none");
              local_28->owner = pcVar3;
              if (local_28->pIndexData->limtotal == 0) {
                _Var7 = std::pow<int,int>(0,0x1d5d05);
                local_28->extra_flags[0] = (long)_Var7 | local_28->extra_flags[0];
              }
            }
            obj_to_char(local_28,local_38);
            if (local_10->command == 'E') {
              if (local_10->arg3 == 0x10) {
                local_1290 = (obj_data *)get_eq_char(local_38,0x10);
                if (local_1290 == (obj_data *)0x0) {
                  equip_char(local_38,local_28,(int)local_10->arg3,true);
                }
                else {
                  unequip_char(local_38,local_1290,true);
                  equip_char(local_38,local_1290,0x12,true);
                  equip_char(local_38,local_28,0x10,true);
                }
              }
              else if (local_10->arg3 == 0x12) {
                lVar6 = get_eq_char(local_38,0x10);
                if (lVar6 == 0) {
                  equip_char(local_38,local_28,0x10,true);
                }
                else {
                  equip_char(local_38,local_28,(int)local_10->arg3,true);
                }
              }
              else {
                equip_char(local_38,local_28,(int)local_10->arg3,true);
              }
            }
            local_49 = 1;
          }
        }
        break;
      case (CLogger *)0x2:
        local_1261 = 0;
        if (local_38 != (char_data *)0x0) {
          for (local_1260 = local_38->in_room->people; local_1260 != (char_data *)0x0;
              local_1260 = local_1260->next_in_room) {
            uVar2 = is_npc(local_1260);
            if (((uVar2 & 1) != 0) && (local_10->arg2 == local_1260->pIndexData->vnum)) {
              local_1261 = 1;
              break;
            }
          }
          if (((local_49 & 1) != 0) && ((local_1261 & 1) != 0)) {
            add_follower(local_38,local_1260);
            local_38->leader = local_1260;
          }
        }
        break;
      default:
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
        fmt_09._M_str = (char *)in_stack_ffffffffffffec58;
        fmt_09._M_len = (size_t)in_stack_ffffffffffffec50;
        CLogger::Warn<char&>(this,fmt_09,(char *)in_stack_ffffffffffffec40);
        break;
      case (CLogger *)0x9:
        local_1278 = get_mob_index(iVar1);
        if (local_1278 == (MOB_INDEX_DATA *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
          fmt._M_str = (char *)in_stack_ffffffffffffec58;
          fmt._M_len = (size_t)in_stack_ffffffffffffec50;
          CLogger::Warn<short&>(this,fmt,in_stack_ffffffffffffec40);
        }
        else {
          local_1270 = get_room_index((int)((ulong)in_stack_ffffffffffffec18 >> 0x20));
          if (local_1270 == (ROOM_INDEX_DATA *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
            fmt_00._M_str = (char *)in_stack_ffffffffffffec58;
            fmt_00._M_len = (size_t)in_stack_ffffffffffffec50;
            CLogger::Warn<short&>(this,fmt_00,in_stack_ffffffffffffec40);
          }
          else if (local_1278->count < local_10->arg2) {
            local_1294 = 0;
            for (local_20 = local_1270->people; local_20 != (CHAR_DATA *)0x0;
                local_20 = local_20->next_in_room) {
              if ((local_20->pIndexData == local_1278) &&
                 (local_1294 = local_1294 + 1, local_10->arg4 <= local_1294)) {
                local_49 = 0;
                break;
              }
            }
            if (local_1294 < local_10->arg4) {
              local_18 = create_mobile(in_stack_ffffffffffffece0);
              uVar2 = room_is_dark(local_8);
              if ((uVar2 & 1) != 0) {
                _Var7 = std::pow<int,int>(0,0x1d51bd);
                local_18->affected_by[0] = (long)_Var7 | local_18->affected_by[0];
              }
              local_12c0 = get_room_index((int)((ulong)in_stack_ffffffffffffec18 >> 0x20));
              if (local_12c0 != (ROOM_INDEX_DATA *)0x0) {
                in_stack_ffffffffffffec40 = (short *)local_12c0->room_flags[0];
                _Var7 = std::pow<int,int>(0,0x1d5225);
                if (((ulong)in_stack_ffffffffffffec40 & (long)_Var7) != 0) {
                  _Var7 = std::pow<int,int>(0,0x1d5247);
                  local_18->act[0] = (long)_Var7 | local_18->act[0];
                }
              }
              local_18->zone = local_1270->area;
              char_to_room(local_18,local_8);
              local_38 = local_18;
              if (local_18->level + -2 < 0) {
                local_13c4 = 0;
              }
              else {
                if (local_18->level + -2 < 0x33) {
                  local_13c8 = local_18->level + -2;
                }
                else {
                  local_13c8 = 0x32;
                }
                local_13c4 = local_13c8;
              }
              local_50 = local_13c4;
              local_49 = 1;
            }
          }
          else {
            local_49 = 0;
          }
        }
        break;
      case (CLogger *)0xb:
        local_1280 = get_obj_index(iVar1);
        if (local_1280 == (OBJ_INDEX_DATA *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
          fmt_01._M_str = (char *)in_stack_ffffffffffffec58;
          fmt_01._M_len = (size_t)in_stack_ffffffffffffec50;
          CLogger::Warn<short&>(this,fmt_01,in_stack_ffffffffffffec40);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
          in_stack_ffffffffffffec08 = &local_10->arg4;
          fmt_10._M_len._4_4_ = in_stack_ffffffffffffec64;
          fmt_10._M_len._0_4_ = in_stack_ffffffffffffec60;
          fmt_10._M_str = (char *)in_stack_ffffffffffffec68;
          CLogger::Warn<short&,short&,short&,short&>
                    (in_stack_ffffffffffffec58,fmt_10,in_stack_ffffffffffffec50,(short *)this,
                     in_stack_ffffffffffffec40,
                     (short *)CONCAT44(in_stack_ffffffffffffeca4,in_stack_ffffffffffffeca0));
        }
        else {
          local_1270 = get_room_index((int)((ulong)in_stack_ffffffffffffec18 >> 0x20));
          if (local_1270 == (ROOM_INDEX_DATA *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
            fmt_02._M_str = (char *)in_stack_ffffffffffffec58;
            fmt_02._M_len = (size_t)in_stack_ffffffffffffec50;
            CLogger::Warn<short&>(this,fmt_02,in_stack_ffffffffffffec40);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
            in_stack_ffffffffffffec08 = &local_10->arg4;
            fmt_11._M_len._4_4_ = in_stack_ffffffffffffec64;
            fmt_11._M_len._0_4_ = in_stack_ffffffffffffec60;
            fmt_11._M_str = (char *)in_stack_ffffffffffffec68;
            CLogger::Warn<short&,short&,short&,short&>
                      (in_stack_ffffffffffffec58,fmt_11,in_stack_ffffffffffffec50,(short *)this,
                       in_stack_ffffffffffffec40,
                       (short *)CONCAT44(in_stack_ffffffffffffeca4,in_stack_ffffffffffffeca0));
          }
          else {
            for (local_30 = local_1270->contents; local_30 != (obj_data *)0x0;
                local_30 = local_30->next_content) {
              if (((local_30->pIndexData->vnum == local_1280->vnum) &&
                  (uVar2 = is_obj_stat(local_30,0x21), (uVar2 & 1) == 0)) &&
                 ((uVar2 = is_obj_stat(local_30,0x18), (uVar2 & 1) == 0 &&
                  (((uVar2 = is_obj_stat(local_30,0x17), (uVar2 & 1) == 0 &&
                    (local_30->item_type == 0xf)) && (local_30->contains == (OBJ_DATA *)0x0)))))) {
                extract_obj(local_30);
              }
            }
            if (((local_1280->limcount < local_1280->limtotal) || (local_1280->limtotal < 1)) &&
               (iVar1 = count_obj_list(local_1280,local_1270->contents), iVar1 < 1)) {
              local_1304[0] = number_fuzzy(in_stack_ffffffffffffec14);
              local_1308 = 0x32;
              std::min<int>(local_1304,&local_1308);
              local_28 = create_object(in_stack_ffffffffffffecc0,in_stack_ffffffffffffecbc);
              local_28->cost = 0;
              pcVar3 = (char *)palloc_string("none");
              local_28->owner = pcVar3;
              pcVar3 = (char *)palloc_string("someone a long long time ago");
              local_28->talked = pcVar3;
              obj_to_room(local_28,local_8);
              local_49 = 1;
            }
            else {
              local_49 = 0;
            }
          }
        }
        break;
      case (CLogger *)0xc:
        local_1280 = get_obj_index(iVar1);
        if (local_1280 == (OBJ_INDEX_DATA *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
          fmt_03._M_str = (char *)in_stack_ffffffffffffec58;
          fmt_03._M_len = (size_t)in_stack_ffffffffffffec50;
          CLogger::Warn<short&>(this,fmt_03,in_stack_ffffffffffffec40);
        }
        else {
          local_1288 = get_obj_index((int)((ulong)in_stack_ffffffffffffec18 >> 0x20));
          if (local_1288 == (OBJ_INDEX_DATA *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
            fmt_04._M_str = (char *)in_stack_ffffffffffffec58;
            fmt_04._M_len = (size_t)in_stack_ffffffffffffec50;
            CLogger::Warn<short&>(this,fmt_04,in_stack_ffffffffffffec40);
          }
          else {
            if (local_10->arg2 < 0x33) {
              if (local_10->arg2 == -1) {
                local_1298 = 999;
              }
              else {
                local_1298 = (int)local_10->arg2;
              }
            }
            else {
              local_1298 = 6;
            }
            if ((((local_8->area->nplayer < 2) &&
                 (local_40 = (obj_data *)get_obj_type(local_1288), local_40 != (obj_data *)0x0)) &&
                ((local_40->in_room != (ROOM_INDEX_DATA *)0x0 || ((local_49 & 1) != 0)))) &&
               ((((local_1280->limtotal < 1 || (local_1280->limcount < local_1280->limtotal)) &&
                 (local_1280->count < local_1298)) &&
                (local_1294 = count_obj_list(local_1280,local_40->contains),
                local_1294 <= local_10->arg4)))) {
              do {
                if (local_10->arg4 <= local_1294) break;
                number_fuzzy(in_stack_ffffffffffffec14);
                local_28 = create_object(in_stack_ffffffffffffecc0,in_stack_ffffffffffffecbc);
                pcVar3 = (char *)palloc_string("none");
                local_28->owner = pcVar3;
                obj_to_obj(local_28,local_40);
                local_1294 = local_1294 + 1;
              } while ((local_1280->limcount < local_1280->limtotal) || (local_1280->limtotal < 1));
              local_40->value[1] = local_40->pIndexData->value[1];
              local_49 = 1;
            }
            else {
              local_49 = 0;
            }
          }
        }
        break;
      case (CLogger *)0xe:
        local_1270 = get_room_index(iVar1);
        if (local_1270 == (ROOM_INDEX_DATA *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffec20,(char *)in_stack_ffffffffffffec18);
          fmt_08._M_str = (char *)in_stack_ffffffffffffec58;
          fmt_08._M_len = (size_t)in_stack_ffffffffffffec50;
          CLogger::Warn<short&>(this,fmt_08,in_stack_ffffffffffffec40);
        }
        else {
          for (in_stack_ffffffffffffec64 = 0; in_stack_ffffffffffffec64 < local_10->arg2 + -1;
              in_stack_ffffffffffffec64 = in_stack_ffffffffffffec64 + 1) {
            in_stack_ffffffffffffec60 =
                 number_range(in_stack_ffffffffffffec10,
                              (int)((ulong)in_stack_ffffffffffffec08 >> 0x20));
            in_stack_ffffffffffffec68 = local_1270->exit[in_stack_ffffffffffffec64];
            local_1270->exit[in_stack_ffffffffffffec64] =
                 local_1270->exit[in_stack_ffffffffffffec60];
            local_1270->exit[in_stack_ffffffffffffec60] = in_stack_ffffffffffffec68;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void reset_room(ROOM_INDEX_DATA *pRoom)
{
	RESET_DATA *pReset;
	CHAR_DATA *pMob;
	CHAR_DATA *mob;
	OBJ_DATA *pObj, *pObj2;
	CHAR_DATA *LastMob = nullptr;
	OBJ_DATA *LastObj = nullptr;
	EXIT_DATA *pexit = nullptr;
	bool last;
	int level = 0;
	char buf[MSL];
	CHAR_DATA *rch;
	bool found;

	if (!pRoom)
		return;

	pMob = nullptr;
	last = true;

	if (pRoom->trap)
		pRoom->trap->armed = true;

	for (pReset = pRoom->reset_first; pReset != nullptr; pReset = pReset->next)
	{
		ROOM_INDEX_DATA *pRoomIndex = nullptr;
		MOB_INDEX_DATA *pMobIndex = nullptr;
		OBJ_INDEX_DATA *pObjIndex = nullptr;
		OBJ_INDEX_DATA *pObjToIndex = nullptr;
		OBJ_DATA *secondary = nullptr;
		int count, limit;

		switch (pReset->command)
		{
			case 'M':
				pMobIndex = get_mob_index(pReset->arg1);

				if (pMobIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'M': bad vnum {}.", pReset->arg1);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'R': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pMobIndex->count >= pReset->arg2)
				{
					last= false;
					break;
				}

				count = 0;
				for (mob = pRoomIndex->people; mob != nullptr; mob = mob->next_in_room)
				{
					if (mob->pIndexData == pMobIndex)
					{
						count++;
						if (count >= pReset->arg4)
						{
							last= false;
							break;
						}
					}
				}

				if (count >= pReset->arg4)
					break;

				pMob = create_mobile(pMobIndex);

				/*
				* Some more hard coding.
				*/
				if (room_is_dark(pRoom))
					SET_BIT(pMob->affected_by, AFF_INFRARED);

				/*
				* Pet shop mobiles get ACT_PET set.
				*/
				{
					ROOM_INDEX_DATA *pRoomIndexPrev;

					pRoomIndexPrev = get_room_index(pRoom->vnum - 1);
					if (pRoomIndexPrev && IS_SET(pRoomIndexPrev->room_flags, ROOM_PET_SHOP))
						SET_BIT(pMob->act, ACT_PET);
				}

				pMob->zone = pRoomIndex->area;

				char_to_room(pMob, pRoom);

				LastMob = pMob;
				level = URANGE(0, pMob->level - 2, LEVEL_HERO - 1); /* -1 ROM */
				last = true;
				break;
			case 'O':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 1 : bad vnum {}", pReset->arg1);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 2 : bad vnum {}.", pReset->arg3);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				for (pObj2 = pRoomIndex->contents; pObj2; pObj2 = pObj2->next_content)
				{
					if (pObj2->pIndexData->vnum == pObjIndex->vnum
						&& !is_obj_stat(pObj2, ITEM_DONATION_PIT)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_PC)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_NPC)
						&& pObj2->item_type == ITEM_CONTAINER
						&& !pObj2->contains)
					{
						extract_obj(pObj2);
					}
				}

				if ((pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					|| count_obj_list(pObjIndex, pRoomIndex->contents) > 0)
				{
					last= false;
					break;
				}

				pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
				pObj->cost = 0;
				pObj->owner = palloc_string("none");
				pObj->talked = palloc_string("someone a long long time ago");

				obj_to_room(pObj, pRoom);

				last = true;
				break;
			case 'P':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg1);
					continue;
				}

				pObjToIndex = get_obj_index(pReset->arg3);

				if (!pObjToIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pReset->arg2 > 50)
					limit = 6;
				else if (pReset->arg2 == -1)
					limit = 999;
				else
					limit = pReset->arg2;

				if (pRoom->area->nplayer > 1
					|| (LastObj = get_obj_type(pObjToIndex)) == nullptr
					|| (LastObj->in_room == nullptr && !last)
					|| (pObjIndex->limtotal > 0 && pObjIndex->limcount >= pObjIndex->limtotal)
					|| (pObjIndex->count >= limit /* && number_range(0,4) != 0 */)
					|| (count = count_obj_list(pObjIndex, LastObj->contains)) > pReset->arg4)
				{
					last= false;
					break;
				}

				while (count < pReset->arg4)
				{
					pObj = create_object(pObjIndex, number_fuzzy(LastObj->level));
					pObj->owner = palloc_string("none");
					obj_to_obj(pObj, LastObj);

					count++;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
						break;
				}

				LastObj->value[1] = LastObj->pIndexData->value[1];
				last = true;
				break;
			case 'G':
			case 'E':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': bad vnum {}.", pReset->arg1);
					continue;
				}

				if (!last)
					break;

				if (!LastMob)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': null mob for vnum {}.", pReset->arg1);
					last= false;
					break;
				}

				if (LastMob->pIndexData->pShop)
				{
					int olevel = 0, i, j;

					if (!pObjIndex->new_format)
					{
						switch (pObjIndex->item_type)
						{
							case ITEM_PILL:
							case ITEM_POTION:
							case ITEM_SCROLL:
								olevel = 53;
								for (i = 1; i < 5; i++)
								{
									if (pObjIndex->value[i] > 0)
									{
										for (j = 0; j < MAX_CLASS; j++)
										{
											olevel = std::min(olevel, (int)skill_table[pObjIndex->value[i]].skill_level[j]);
										}
									}
								}
								olevel = std::max(0, (olevel * 3 / 4) - 2);
								break;
							case ITEM_WAND:
								olevel = number_range(10, 20);
								break;
							case ITEM_STAFF:
								olevel = number_range(15, 25);
								break;
							case ITEM_ARMOR:
								olevel = number_range(5, 15);
								break;
							case ITEM_WEAPON:
								olevel = number_range(5, 15);
								break;
							case ITEM_TREASURE:
								olevel = number_range(10, 20);
								break;
							default:
								olevel = 0;
								break;
						}
					}

					pObj = create_object(pObjIndex, olevel);
					pObj->owner = palloc_string("none");

					if (pObj->pIndexData->limtotal == 0)
						SET_BIT(pObj->extra_flags, ITEM_INVENTORY);
				}
				else /* ROM OLC else version */
				{
					int limit;

					if (pReset->arg2 > 50) /* old format */
						limit = 6;
					else if (pReset->arg2 == -1 || pReset->arg2 == 0) /* no limit */
						limit = 999;
					else
						limit = pReset->arg2;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					{
						break;
					}
					else
					{
						pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
					}

					pObj->owner = palloc_string("none");
				}

				obj_to_char(pObj, LastMob);

				if (pReset->command == 'E')
				{
					if (pReset->arg3 == 16)
					{
						secondary = get_eq_char(LastMob, WEAR_WIELD);

						if (secondary != nullptr)
						{
							unequip_char(LastMob, secondary, true);
							equip_char(LastMob, secondary, 18, true);
							equip_char(LastMob, pObj, 16, true);
						}
						else
						{
							equip_char(LastMob, pObj, pReset->arg3, true);
						}
					}
					else if (pReset->arg3 == 18)
					{
						if (get_eq_char(LastMob, WEAR_WIELD) == nullptr)
							equip_char(LastMob, pObj, 16, true);
						else
							equip_char(LastMob, pObj, pReset->arg3, true);
					}
					else
					{
						equip_char(LastMob, pObj, pReset->arg3, true);
					}
				}
				last = true;
				break;

			case 'F':
				found= false;

				if (!LastMob)
					continue;

				for (rch = LastMob->in_room->people; rch != nullptr; rch = rch->next_in_room)
				{
					if (is_npc(rch) && (pReset->arg2 == rch->pIndexData->vnum))
					{
						found = true;
						break;
					}
				}

				if (!last || !found)
					break;

				add_follower(LastMob, rch);
				LastMob->leader = rch;
				break;
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'D': bad vnum {}.", pReset->arg1);
					continue;
				}

				pexit = pRoomIndex->exit[pReset->arg2];

				if (pexit == nullptr)
					break;

				SET_BIT(pexit->exit_info, EX_ISDOOR);

				switch (pReset->arg3)
				{
					case 0:
						REMOVE_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 1:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 2:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						SET_BIT(pexit->exit_info, EX_LOCKED);
						break;
				}

				last = true;
				break;
			case 'R':
				pRoomIndex = get_room_index(pReset->arg1);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'R': bad vnum {}.", pReset->arg1);
					continue;
				}

				{
					EXIT_DATA *pExit;
					int d0;
					int d1;

					for (d0 = 0; d0 < pReset->arg2 - 1; d0++)
					{
						d1 = number_range(d0, pReset->arg2 - 1);
						pExit = pRoomIndex->exit[d0];
						pRoomIndex->exit[d0] = pRoomIndex->exit[d1];
						pRoomIndex->exit[d1] = pExit;
					}
				}

				break;
			default:
				RS.Logger.Warn("Reset_area: bad command {}.", pReset->command);
				break;
		}
	}
}